

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O2

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::serializer<pstore::extent<unsigned_char>,void>::
write<pstore::serialize::archive::database_writer&>(database_writer *archive,value_type *r)

{
  result_type rVar1;
  address local_20;
  
  local_20.a_ = (r->addr).a_.a_;
  rVar1 = serialize::archive::
          writer_base<pstore::serialize::archive::details::database_writer_policy>::
          put<unsigned_long>(&archive->
                              super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                             ,&local_20.a_);
  serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
  put<unsigned_long>(&archive->
                      super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                     ,&r->size);
  return (archive_result_type<pstore::serialize::archive::database_writer_&>)rVar1.a_;
}

Assistant:

static auto write (Archive && archive, value_type const & r)
                -> archive_result_type<Archive> {
                auto const resl = serialize::write (archive, r.addr.absolute ());
                serialize::write (archive, r.size);
                return resl;
            }